

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decrypt.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_16_2_1d87e746 func;
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  rep rVar4;
  int __oflag;
  duration<long,_std::ratio<1L,_1000000000L>_> local_14d8;
  ofstream local_14d0 [8];
  ofstream FileOut;
  path local_12c0;
  span<const_unsigned_int,_256UL> local_1298;
  undefined1 local_1290 [8];
  ifstreambuf FileIn;
  char **argv_local;
  int argc_local;
  
  FileIn._4720_8_ = argv;
  if (argc < 3) {
    puts(
        "Decrypt user-created .sai files:\n\tDecrypt.exe (filename) (output)\n\tWunkolo - Wunkolo@gmail.com"
        );
    argv_local._4_4_ = 1;
  }
  else {
    std::span<const_unsigned_int,_256UL>::span<unsigned_int,_256UL>
              (&local_1298,(array<unsigned_int,_256UL> *)sai::Keys::User);
    sai::ifstreambuf::ifstreambuf((ifstreambuf *)local_1290,local_1298);
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_12c0,(char **)(FileIn._4720_8_ + 8),auto_format);
    sai::ifstreambuf::open((ifstreambuf *)local_1290,(char *)&local_12c0,__oflag);
    std::filesystem::__cxx11::path::~path(&local_12c0);
    bVar1 = sai::ifstreambuf::is_open((ifstreambuf *)local_1290);
    if (bVar1) {
      std::ofstream::ofstream(local_14d0);
      std::ofstream::open((char *)local_14d0,(_Ios_Openmode)*(undefined8 *)(FileIn._4720_8_ + 0x10))
      ;
      bVar2 = std::ofstream::is_open();
      bVar1 = (bVar2 & 1) != 0;
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"File decrypted in:");
        func.FileIn = (ifstreambuf *)local_1290;
        func.FileOut = local_14d0;
        local_14d8 = Benchmark<std::chrono::duration<long,std::ratio<1l,1000000000l>>>::
                     Run<main::__0>(func);
        rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_14d8);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar4);
        poVar3 = std::operator<<(poVar3,"ns");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for writing: ");
        poVar3 = std::operator<<(poVar3,*(char **)(FileIn._4720_8_ + 0x10));
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      argv_local._4_4_ = (uint)!bVar1;
      std::ofstream::~ofstream(local_14d0);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for reading: ");
      poVar3 = std::operator<<(poVar3,*(char **)(FileIn._4720_8_ + 8));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    sai::ifstreambuf::~ifstreambuf((ifstreambuf *)local_1290);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
	{
		puts(Help);
		return EXIT_FAILURE;
	}

	sai::ifstreambuf FileIn;
	FileIn.open(argv[1]);

	if( !FileIn.is_open() )
	{
		std::cout << "Error opening file for reading: " << argv[1] << std::endl;
		return EXIT_FAILURE;
	}

	std::ofstream FileOut;
	FileOut.open(argv[2], std::ios::binary);

	if( !FileOut.is_open() )
	{
		std::cout << "Error opening file for writing: " << argv[2] << std::endl;
		return EXIT_FAILURE;
	}

	std::cout << "File decrypted in:" << Benchmark<std::chrono::nanoseconds>::Run([&]() -> void {
											 FileOut << &FileIn;
										 }).count()
			  << "ns" << std::endl;

	return EXIT_SUCCESS;
}